

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiTable::~ImGuiTable(ImGuiTable *this)

{
  ImDrawListSplitter *in_RDI;
  
  ImGui::MemFree(in_RDI);
  ImVector<ImGuiTableColumnSortSpecs>::~ImVector((ImVector<ImGuiTableColumnSortSpecs> *)in_RDI);
  ImDrawListSplitter::~ImDrawListSplitter(in_RDI);
  ImGuiTextBuffer::~ImGuiTextBuffer((ImGuiTextBuffer *)0x1df581);
  return;
}

Assistant:

IMGUI_API ~ImGuiTable()     { IM_FREE(RawData); }